

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O3

void Imf_2_5::loadFlatImage(string *fileName,Header *hdr,FlatImage *img)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *pAVar3;
  bool multiPart;
  bool deep;
  bool tiled;
  stringstream _iex_throw_s;
  bool local_1a3;
  bool local_1a2;
  bool local_1a1;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  bVar1 = isOpenExrFile((fileName->_M_dataplus)._M_p,&local_1a1,&local_1a2,&local_1a3);
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cannot load image file ",0x17);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,".  The file is not an OpenEXR file.",0x23);
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)local_1a0);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  if (local_1a3 != true) {
    if (local_1a2 != true) {
      if (local_1a1 == true) {
        loadFlatTiledImage(fileName,hdr,img);
      }
      else {
        loadFlatScanLineImage(fileName,hdr,img);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"Cannot load deep image file ",0x1c);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_190,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," as a flat image.",0x11);
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)local_1a0);
    __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cannot load image file ",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,".  Multi-part file loading is not supported.",0x2c);
  pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar3,(stringstream *)local_1a0);
  __cxa_throw(pAVar3,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
loadFlatImage
    (const string &fileName,
     Header &hdr,
     FlatImage &img)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str(), tiled, deep, multiPart))
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (ArgExc, "Cannot load image file " << fileName << ".  "
                       "Multi-part file loading is not supported.");
    }

    if (deep)
    {
        THROW (ArgExc, "Cannot load deep image file " << fileName << " "
                       "as a flat image.");
    }

    if (tiled)
        loadFlatTiledImage (fileName, hdr, img);
    else
        loadFlatScanLineImage (fileName, hdr, img);
}